

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markethandler.h
# Opt level: O3

void __thiscall
hedg::Market_Handler::activate_market
          (Market_Handler *this,string *market_id,Market_Projection *market_projection)

{
  threadsafe_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>
  *this_00;
  mapped_type *pmVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
  local_a0;
  
  pmVar1 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<bool>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<bool>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->active,market_id);
  LOCK();
  (pmVar1->_M_base)._M_i = true;
  UNLOCK();
  this_00 = this->active_markets_;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_hedg::Market_Projection_&,_true>
            (&local_a0,market_id,market_projection);
  threadsafe_queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>
  ::push(this_00,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.second.country_code_._M_dataplus._M_p != &local_a0.second.country_code_.field_2) {
    operator_delete(local_a0.second.country_code_._M_dataplus._M_p,
                    local_a0.second.country_code_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.second.event_type_._M_dataplus._M_p != &local_a0.second.event_type_.field_2) {
    operator_delete(local_a0.second.event_type_._M_dataplus._M_p,
                    local_a0.second.event_type_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.second.market_start_time_._M_dataplus._M_p !=
      &local_a0.second.market_start_time_.field_2) {
    operator_delete(local_a0.second.market_start_time_._M_dataplus._M_p,
                    local_a0.second.market_start_time_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
    operator_delete(local_a0.first._M_dataplus._M_p,local_a0.first.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void activate_market(std::string market_id, Market_Projection market_projection) {
		active[market_id].store(true);
		active_markets_.push({ market_id, market_projection });
	}